

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O2

pboolean p_ini_file_parse(PIniFile *file,PError **error)

{
  int iVar1;
  PErrorIO code;
  pint native_code;
  FILE *__stream;
  char *pcVar2;
  pchar *__s;
  size_t sVar3;
  pchar *ppVar4;
  PList *pPVar5;
  undefined8 *mem;
  pboolean pVar6;
  long lVar7;
  PIniSection *local_c68;
  pchar key [1025];
  pchar value [1025];
  pchar src_line [1025];
  
  if (file == (PIniFile *)0x0) {
    pVar6 = 0;
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    pVar6 = 1;
    if (file->is_parsed == 0) {
      __stream = fopen(file->path,"r");
      if (__stream == (FILE *)0x0) {
        code = p_error_get_last_io();
        native_code = p_error_get_last_system();
        p_error_set_error_p(error,code,native_code,"Failed to open file for reading");
        pVar6 = 0;
      }
      else {
        memset(src_line,0,0x401);
        local_c68 = (PIniSection *)0x0;
        while( true ) {
          pVar6 = 1;
          pcVar2 = fgets(src_line,0x401,__stream);
          if (pcVar2 == (char *)0x0) break;
          lVar7 = 3;
          if (((src_line[2] != -0x41 || (src_line[1] != -0x45 || src_line[0] != -0x11)) &&
              (lVar7 = 2, src_line[1] != -1 || src_line[0] != -2)) &&
             (src_line[1] != -2 || src_line[0] != -1)) {
            lVar7 = (ulong)(src_line[3] == -1 &&
                           (src_line[2] == -2 && (src_line[0] == '\0' && src_line[1] == '\0'))) << 2
            ;
          }
          __s = p_strchomp(src_line + lVar7);
          if (__s != (pchar *)0x0) {
            sVar3 = strlen(__s);
            if (0x400 < sVar3) {
              __s[0x400] = '\0';
            }
            if (((*__s == '[') && (sVar3 = strlen(__s), __s[sVar3 - 1] == ']')) &&
               (iVar1 = __isoc99_sscanf(__s,"[%[^]]",key), iVar1 == 1)) {
              ppVar4 = p_strchomp(key);
              if (ppVar4 != (pchar *)0x0) {
                sVar3 = strlen(ppVar4);
                if (0x400 < sVar3) {
                  ppVar4[0x400] = '\0';
                }
                strcpy(key,ppVar4);
                p_free(ppVar4);
                if (local_c68 != (PIniSection *)0x0) {
                  if (local_c68->keys == (PList *)0x0) {
                    pp_ini_file_section_free(local_c68);
                  }
                  else {
                    pPVar5 = p_list_prepend(file->sections,local_c68);
                    file->sections = pPVar5;
                  }
                }
                local_c68 = (PIniSection *)p_malloc0(0x10);
                if (local_c68 != (PIniSection *)0x0) {
                  ppVar4 = p_strdup(key);
                  local_c68->name = ppVar4;
                  if (ppVar4 != (pchar *)0x0) goto LAB_00110fab;
                  p_free(local_c68);
                }
                local_c68 = (PIniSection *)0x0;
              }
            }
            else {
              iVar1 = __isoc99_sscanf(__s,"%[^=] = \"%[^\"]\"",key,value);
              if ((((iVar1 == 2) ||
                   (iVar1 = __isoc99_sscanf(__s,"%[^=] = \'%[^\']\'",key,value), iVar1 == 2)) ||
                  (iVar1 = __isoc99_sscanf(__s,"%[^=] = %[^;#]",key,value), iVar1 == 2)) &&
                 (ppVar4 = p_strchomp(key), ppVar4 != (pchar *)0x0)) {
                sVar3 = strlen(ppVar4);
                if (0x400 < sVar3) {
                  ppVar4[0x400] = '\0';
                }
                strcpy(key,ppVar4);
                p_free(ppVar4);
                ppVar4 = p_strchomp(value);
                if (ppVar4 != (pchar *)0x0) {
                  sVar3 = strlen(ppVar4);
                  if (0x400 < sVar3) {
                    ppVar4[0x400] = '\0';
                  }
                  strcpy(value,ppVar4);
                  p_free(ppVar4);
                  iVar1 = bcmp(value,"\"\"",3);
                  if ((iVar1 == 0) || (iVar1 = bcmp(value,"\'\'",3), iVar1 == 0)) {
                    value[0] = '\0';
                  }
                  if (local_c68 == (PIniSection *)0x0) {
                    local_c68 = (PIniSection *)0x0;
                  }
                  else {
                    mem = (undefined8 *)p_malloc0(0x10);
                    if (mem != (undefined8 *)0x0) {
                      ppVar4 = p_strdup(key);
                      *mem = ppVar4;
                      if (ppVar4 != (pchar *)0x0) {
                        ppVar4 = p_strdup(value);
                        mem[1] = ppVar4;
                        if (ppVar4 != (pchar *)0x0) {
                          pPVar5 = p_list_prepend(local_c68->keys,mem);
                          local_c68->keys = pPVar5;
                          goto LAB_00110fab;
                        }
                        p_free((ppointer)*mem);
                      }
                      p_free(mem);
                    }
                  }
                }
              }
            }
LAB_00110fab:
            p_free(__s);
            memset(src_line,0,0x401);
          }
        }
        if (local_c68 != (PIniSection *)0x0) {
          if (local_c68->keys == (PList *)0x0) {
            pp_ini_file_section_free(local_c68);
          }
          else {
            pPVar5 = p_list_append(file->sections,local_c68);
            file->sections = pPVar5;
          }
        }
        iVar1 = fclose(__stream);
        if (iVar1 != 0) {
          printf("** Warning: %s **\n","PIniFile::p_ini_file_parse: fclose() failed");
        }
        file->is_parsed = 1;
      }
    }
  }
  return pVar6;
}

Assistant:

P_LIB_API pboolean
p_ini_file_parse (PIniFile	*file,
		  PError	**error)
{
	PIniSection	*section;
	PIniParameter	*param;
	FILE		*in_file;
	pchar		*dst_line;
	pchar		*tmp_str;
	pchar		src_line[P_INI_FILE_MAX_LINE + 1];
	pchar		key[P_INI_FILE_MAX_LINE + 1];
	pchar		value[P_INI_FILE_MAX_LINE + 1];
	pint		bom_shift;

	if (P_UNLIKELY (file == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (file->is_parsed)
		return TRUE;

	if (P_UNLIKELY ((in_file = fopen (file->path, "r")) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to open file for reading");
		return FALSE;
	}

	dst_line = NULL;
	section  = NULL;
	param    = NULL;

	memset (src_line, 0, sizeof (src_line));

	while (fgets (src_line, sizeof (src_line), in_file) != NULL) {
		/* UTF-8, UTF-16 and UTF-32 BOM detection */
		if ((puchar) src_line[0] == 0xEF && (puchar) src_line[1] == 0xBB && (puchar) src_line[2] == 0xBF)
			bom_shift = 3;
		else if (((puchar) src_line[0] == 0xFE && (puchar) src_line[1] == 0xFF) ||
			 ((puchar) src_line[0] == 0xFF && (puchar) src_line[1] == 0xFE))
			bom_shift = 2;
		else if ((puchar) src_line[0] == 0x00 && (puchar) src_line[1] == 0x00 &&
			 (puchar) src_line[2] == 0xFE && (puchar) src_line[3] == 0xFF)
			bom_shift = 4;
		else if ((puchar) src_line[0] == 0xFF && (puchar) src_line[1] == 0xFE &&
			 (puchar) src_line[2] == 0x00 && (puchar) src_line[3] == 0x00)
			bom_shift = 4;
		else
			bom_shift = 0;

		dst_line = p_strchomp (src_line + bom_shift);

		if (dst_line == NULL)
			continue;

		/* This should not happen */
		if (P_UNLIKELY (strlen (dst_line) > P_INI_FILE_MAX_LINE))
			dst_line[P_INI_FILE_MAX_LINE] = '\0';

		if (dst_line[0] == '[' && dst_line[strlen (dst_line) - 1] == ']' &&
		    sscanf (dst_line, "[%[^]]", key) == 1) {
			/* New section found */
			if ((tmp_str = p_strchomp (key)) != NULL) {
				/* This should not happen */
				if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
					tmp_str[P_INI_FILE_MAX_LINE] = '\0';

				strcpy (key, tmp_str);
				p_free (tmp_str);

				if (section != NULL) {
					if (section->keys == NULL)
						pp_ini_file_section_free (section);
					else
						file->sections = p_list_prepend (file->sections, section);
				}

				section = pp_ini_file_section_new (key);
			}
		} else if (sscanf (dst_line, "%[^=] = \"%[^\"]\"", key, value) == 2 ||
			   sscanf (dst_line, "%[^=] = '%[^\']'", key, value) == 2 ||
			   sscanf (dst_line, "%[^=] = %[^;#]", key, value) == 2) {
			/* New parameter found */
			if ((tmp_str = p_strchomp (key)) != NULL) {
				/* This should not happen */
				if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
					tmp_str[P_INI_FILE_MAX_LINE] = '\0';

				strcpy (key, tmp_str);
				p_free (tmp_str);

				if ((tmp_str = p_strchomp (value)) != NULL) {
					/* This should not happen */
					if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
						tmp_str[P_INI_FILE_MAX_LINE] = '\0';

					strcpy (value, tmp_str);
					p_free (tmp_str);

					if (strcmp (value, "\"\"") == 0 || (strcmp (value, "''") == 0))
						value[0] = '\0';

					if (section != NULL && (param = pp_ini_file_parameter_new (key, value)) != NULL)
						section->keys = p_list_prepend (section->keys, param);
				}
			}
		}

		p_free (dst_line);
		memset (src_line, 0, sizeof (src_line));
	}

	if (section != NULL) {
		if (section->keys == NULL)
			pp_ini_file_section_free (section);
		else
			file->sections = p_list_append (file->sections, section);
	}

	if (P_UNLIKELY (fclose (in_file) != 0))
		P_WARNING ("PIniFile::p_ini_file_parse: fclose() failed");

	file->is_parsed = TRUE;

	return TRUE;
}